

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::update(Group *this,uint64_t planned_time)

{
  pointer ppOVar1;
  Operation *pOVar2;
  long *plVar3;
  pointer ppCVar4;
  Controller *pCVar5;
  _Object *p_Var6;
  View *pVVar7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  uint32_t uVar11;
  _Mem *p_Var12;
  Group *pGVar13;
  uint64_t uVar14;
  _Rb_tree_node_base *p_Var15;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> _Var16;
  UpdateJob *this_00;
  long lVar17;
  pointer ppCVar18;
  pointer ppOVar19;
  float fVar20;
  double dVar21;
  const_iterator v;
  uint8_t selector;
  pthread_mutex_t *local_90;
  double local_88;
  double local_80;
  double local_78;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  double local_60;
  long local_58;
  uint64_t local_50;
  GroupState state;
  const_iterator end;
  
  local_90 = (pthread_mutex_t *)&this->mutex;
  local_50 = planned_time;
  std::mutex::lock((mutex *)&local_90->__data);
  p_Var12 = (_Mem *)r_code::Mem::Get();
  pGVar13 = (Group *)_Mem::get_root(p_Var12);
  if ((pGVar13 == this) ||
     ((this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      views._M_h._M_element_count != 0)) {
    local_58 = (*Now)();
    std::
    _Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
    ::clear(&(this->newly_salient_views)._M_t);
    ppOVar1 = (this->pending_operations).
              super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppOVar19 = (this->pending_operations).
                    super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppOVar19 != ppOVar1;
        ppOVar19 = ppOVar19 + 1) {
      pOVar2 = *ppOVar19;
      (*pOVar2->_vptr_Operation[2])(pOVar2,this);
      (*pOVar2->_vptr_Operation[1])(pOVar2);
    }
    ppOVar19 = (this->pending_operations).
               super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((this->pending_operations).
        super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppOVar19) {
      (this->pending_operations).
      super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppOVar19;
    }
    update_sln_thr(this);
    update_act_thr(this);
    update_vis_thr(this);
    fVar20 = get_sln_thr(this);
    local_88 = (double)CONCAT44(local_88._4_4_,fVar20);
    fVar20 = get_c_act(this);
    local_80 = (double)CONCAT44(local_80._4_4_,fVar20);
    local_64 = get_c_act_thr(this);
    local_60 = update_c_act(this);
    local_68 = get_c_act_thr(this);
    local_6c = get_c_sln(this);
    local_70 = get_c_sln_thr(this);
    local_78 = update_c_sln(this);
    fVar20 = get_c_sln_thr(this);
    state.was_c_active = local_64 < local_80._0_4_;
    local_80 = (double)local_68;
    state.is_c_active = local_80 < local_60;
    state.former_sln_thr = (double)local_88._0_4_;
    state.was_c_salient = local_70 < local_6c;
    local_88 = (double)fVar20;
    state.is_c_salient = local_88 < local_78;
    reset_stats(this);
    v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
             (this->ipgm_views)._M_h._M_before_begin._M_nxt;
    end.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
             (__node_type *)0x0;
    selector = '\0';
    while( true ) {
      bVar8 = all_views_cond(this,&selector,&v,&end);
      if (!bVar8) break;
      cVar9 = (**(code **)(**(long **)(*(long *)((long)v.
                                                  super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ._M_cur + 0x10) + 0x20) + 0x70))();
      if (cVar9 == '\0') {
        uVar14 = r_code::View::get_ijt
                           (*(View **)((long)v.
                                             super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                             ._M_cur + 0x10));
        if (uVar14 < local_50) {
          dVar21 = update_res(this,*(View **)((long)v.
                                                  super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ._M_cur + 0x10));
          if (dVar21 <= 0.0) {
            View::delete_from_object
                      (*(View **)((long)v.
                                        super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                        ._M_cur + 0x10));
            delete_view(this,&v);
          }
          else {
            _update_saliency(this,&state,
                             *(View **)((long)v.
                                              super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                              ._M_cur + 0x10));
            plVar3 = *(long **)(*(long *)((long)v.
                                                super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                ._M_cur + 0x10) + 0x20);
            (**(code **)(*plVar3 + 0x20))(plVar3,0);
            bVar10 = r_code::Atom::getDescriptor();
            if (bVar10 - 0xc9 < 7) {
              _update_activation(this,&state,
                                 *(View **)((long)v.
                                                  super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ._M_cur + 0x10));
            }
            else if (bVar10 == 200) {
              _update_visibility(this,&state,
                                 *(View **)((long)v.
                                                  super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ._M_cur + 0x10));
            }
            v.
            super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
            ._M_cur = *(_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                        *)v.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                          ._M_cur;
          }
        }
        else {
          v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
          ._M_cur = *(_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                      *)v.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                        ._M_cur;
        }
      }
      else {
        delete_view(this,&v);
      }
    }
    if (local_88 < local_78) {
      cov(this);
    }
    for (p_Var15 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var15 !=
        &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      inject_reduction_jobs(this,*(View **)(p_Var15 + 1));
    }
    if ((local_80 < local_60) && (local_88 < local_78)) {
      ppCVar4 = (this->new_controllers).
                super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar18 = (this->new_controllers).
                      super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppCVar18 != ppCVar4;
          ppCVar18 = ppCVar18 + 1) {
        pCVar5 = *ppCVar18;
        p_Var6 = (pCVar5->view->object).object;
        (*p_Var6->_vptr__Object[4])(p_Var6,0);
        cVar9 = r_code::Atom::getDescriptor();
        if (cVar9 == -0x35) {
          _Var16._M_cur = (__node_type *)operator_new(0x28);
          pVVar7 = (View *)pCVar5->view;
          uVar14 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(pVVar7->super_View).object.object,4);
          InputLessPGMSignalingJob::InputLessPGMSignalingJob
                    ((InputLessPGMSignalingJob *)_Var16._M_cur,pVVar7,uVar14 + local_58);
          LOCK();
          ((_Var16._M_cur)->
          super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>).
          super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>.
          _M_storage._M_storage.__align =
               (anon_struct_8_0_00000001_for___align)
               ((long)((_Var16._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                      ._M_storage._M_storage.__align + 1);
          UNLOCK();
          v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
          ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                     )(_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                       )_Var16._M_cur;
          p_Var12 = (_Mem *)r_code::Mem::Get();
          _Mem::pushTimeJob(p_Var12,(TimeJob *)
                                    v.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                    ._M_cur);
LAB_00181e9c:
          core::P<r_exec::TimeJob>::~P((P<r_exec::TimeJob> *)&v);
        }
        else if (cVar9 == -0x34) {
          _Var16._M_cur = (__node_type *)operator_new(0x28);
          pVVar7 = (View *)pCVar5->view;
          uVar14 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(pVVar7->super_View).object.object,4);
          AntiPGMSignalingJob::AntiPGMSignalingJob
                    ((AntiPGMSignalingJob *)_Var16._M_cur,pVVar7,uVar14 + local_58);
          LOCK();
          ((_Var16._M_cur)->
          super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>).
          super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>.
          _M_storage._M_storage.__align =
               (anon_struct_8_0_00000001_for___align)
               ((long)((_Var16._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                      ._M_storage._M_storage.__align + 1);
          UNLOCK();
          v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
          ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                     )(_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                       )_Var16._M_cur;
          p_Var12 = (_Mem *)r_code::Mem::Get();
          _Mem::pushTimeJob(p_Var12,(TimeJob *)
                                    v.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                    ._M_cur);
          goto LAB_00181e9c;
        }
      }
      ppCVar18 = (this->new_controllers).
                 super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((this->new_controllers).
          super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppCVar18) {
        (this->new_controllers).
        super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppCVar18;
      }
    }
    update_stats(this);
    uVar11 = get_upr(this);
    if (uVar11 != 0) {
      p_Var12 = (_Mem *)r_code::Mem::Get();
      this_00 = (UpdateJob *)operator_new(0x28);
      uVar11 = get_upr(this);
      lVar17 = r_code::Utils::GetBasePeriod();
      UpdateJob::UpdateJob(this_00,this,lVar17 * (ulong)uVar11 + local_50);
      _Mem::pushTimeJob(p_Var12,(TimeJob *)this_00);
    }
  }
  else {
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[0xf])(this);
  }
  pthread_mutex_unlock(local_90);
  return;
}

Assistant:

void Group::update(uint64_t planned_time)
{
    std::lock_guard<std::mutex> guard(mutex);

    if (this != _Mem::Get()->get_root() && views.size() == 0) {
        invalidate();
        return;
    }

    uint64_t now = Now();
    //if(get_secondary_group()!=NULL)
    // std::cout<<Utils::RelativeTime(Now())<<" UPR\n";
    //if(this==_Mem::Get()->get_stdin())
    // std::cout<<Utils::RelativeTime(Now())<<" ----------------------------------------------------------------\n";
    newly_salient_views.clear();

    // execute pending operations.
    for (Operation *pending_operation : pending_operations) {
        pending_operation->execute(this);
        delete pending_operation;
    }

    pending_operations.clear();
    // update group's ctrl values.
    update_sln_thr(); // applies decay on sln thr.
    update_act_thr();
    update_vis_thr();
    GroupState state(get_sln_thr(), get_c_act() > get_c_act_thr(), update_c_act() > get_c_act_thr(), get_c_sln() > get_c_sln_thr(), update_c_sln() > get_c_sln_thr());
    reset_stats();
    FOR_ALL_VIEWS_BEGIN_NO_INC(this, v)

    if (v->second->object->is_invalidated()) { // no need to update the view set.
        delete_view(v);
    } else {
        uint64_t ijt = v->second->get_ijt();

        if (ijt >= planned_time) { // in case the update happens later than planned, don't touch views that were injected after the planned update time: update next time.
            ++v;
            continue;
        }

        double res = update_res(v->second); // update resilience: decrement res by 1 in addition to the accumulated changes.

        if (res > 0) {
            _update_saliency(&state, v->second); // apply decay.

            switch (v->second->object->code(0).getDescriptor()) {
            case Atom::GROUP:
                _update_visibility(&state, v->second);
                break;

            case Atom::NULL_PROGRAM:
            case Atom::INSTANTIATED_PROGRAM:
            case Atom::INSTANTIATED_ANTI_PROGRAM:
            case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
            case Atom::INSTANTIATED_CPP_PROGRAM:
            case Atom::COMPOSITE_STATE:
            case Atom::MODEL:
                _update_activation(&state, v->second);
                break;
            }

            ++v;
        } else { // view has no resilience: delete it from the group.
            v->second->delete_from_object();
            delete_view(v);
        }
    }

    FOR_ALL_VIEWS_END

    if (state.is_c_salient) {
        cov();
    }

    // build reduction jobs.
    std::multiset<P<View>, r_code::View::Less>::const_iterator v;

    for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
        inject_reduction_jobs(*v);
    }

    if (state.is_c_active && state.is_c_salient) { // build signaling jobs for new ipgms.
        for (Controller *new_controller : new_controllers) {
            switch (new_controller->getObject()->code(0).getDescriptor()) {
            case Atom::INSTANTIATED_ANTI_PROGRAM: { // inject signaling jobs for |ipgm (tsc).
                P<TimeJob> j = new AntiPGMSignalingJob(new_controller->getView(), now + Utils::GetTimestamp<Code>(new_controller->getObject(), IPGM_TSC));
                _Mem::Get()->pushTimeJob(j);
                break;
            }

            case Atom::INSTANTIATED_INPUT_LESS_PROGRAM: { // inject a signaling job for an input-less pgm.
                P<TimeJob> j = new InputLessPGMSignalingJob(new_controller->getView(), now + Utils::GetTimestamp<Code>(new_controller->getObject(), IPGM_TSC));
                _Mem::Get()->pushTimeJob(j);
                break;
            }
            }
        }

        new_controllers.clear();
    }

    update_stats(); // triggers notifications.

    if (get_upr() > 0) { // inject the next update job for the group.
        _Mem::Get()->pushTimeJob(new UpdateJob(this, planned_time + get_upr()*Utils::GetBasePeriod()));
    }

    //if(get_secondary_group()!=NULL)
    //if(this==_Mem::Get()->get_stdin())
    // std::cout<<Utils::RelativeTime(Now())<<" ++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n";
}